

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  deUint32 wrapS;
  char *pcVar2;
  TestContext *pTVar3;
  Context *pCVar4;
  RenderContext *pRVar5;
  ContextInfo *renderCtxInfo;
  byte bVar6;
  undefined4 uVar7;
  int extraout_EAX;
  TestNode *pTVar8;
  size_t sVar9;
  Texture2DMipmapCase *pTVar10;
  long lVar11;
  long lVar12;
  Texture2DGenMipmapCase *this_00;
  Texture2DLodControlCase *pTVar13;
  TextureCubeMipmapCase *this_01;
  TestNode *pTVar14;
  TextureCubeGenMipmapCase *this_02;
  TextureCubeLodControlCase *pTVar15;
  Texture3DMipmapCase *pTVar16;
  Texture3DLodControlCase *pTVar17;
  TextureMipmapTests *pTVar18;
  anon_struct_16_3_1dd0bf0d *paVar19;
  bool bVar20;
  CoordType CVar21;
  TextureMipmapTests *local_228;
  anon_struct_16_3_5cb0d78b *local_220;
  anon_struct_16_3_5cb0d78b *local_218;
  TestNode *local_210;
  TestNode *local_208;
  TestNode *local_200;
  long *local_1f8;
  long local_1e8 [2];
  TestNode *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  ostringstream name;
  ios_base local_138 [264];
  
  local_210 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_210,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  local_208 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_208,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Mipmapping");
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"3d",
             "3D Texture Mipmapping");
  tcu::TestNode::addChild((TestNode *)this,local_210);
  tcu::TestNode::addChild((TestNode *)this,local_208);
  local_1d8 = pTVar8;
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar12 = 0;
  local_228 = this;
  do {
    pTVar18 = local_228;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_1b8 = lVar12;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (pTVar18->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[lVar12].name,init::coordTypes[lVar12].desc);
    tcu::TestNode::addChild(local_210,pTVar8);
    local_1c8 = (ulong)init::coordTypes[lVar12].type;
    lVar12 = 0;
    do {
      local_200 = (TestNode *)(init::minFilterModes + lVar12);
      lVar11 = 0;
      local_1b0 = lVar12;
      do {
        local_218 = (anon_struct_16_3_5cb0d78b *)(init::wrapModes + lVar11);
        local_220 = (anon_struct_16_3_5cb0d78b *)&init::tex2DSizes[0].height;
        local_1d0 = 0;
        local_1c0 = lVar11;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          pcVar2 = (char *)local_200->_vptr_TestNode;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)&local_228 + (int)*(undefined8 *)(_name + -0x18) + 0x80);
          }
          else {
            sVar9 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
          pcVar2 = local_218->name;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)&local_228 + (int)*(undefined8 *)(_name + -0x18) + 0x80);
          }
          else {
            sVar9 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
          }
          pcVar2 = ((anon_struct_16_3_1dd0bf0d *)((long)local_220 + -0xc))->name;
          if (pcVar2 != (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
            sVar9 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
          }
          pTVar10 = (Texture2DMipmapCase *)operator_new(0x100);
          pTVar3 = (pTVar18->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pCVar4 = (pTVar18->super_TestCaseGroup).m_context;
          pRVar5 = pCVar4->m_renderCtx;
          renderCtxInfo = pCVar4->m_contextInfo;
          std::__cxx11::stringbuf::str();
          CVar21 = (CoordType)local_1c8;
          Texture2DMipmapCase::Texture2DMipmapCase
                    (pTVar10,pTVar3,pRVar5,renderCtxInfo,(char *)local_1f8,"",CVar21,
                     *(deUint32 *)&local_200->m_testCtx,local_218->format,local_218->format,0x1908,
                     0x1401,*(int *)((long)local_220 + -4),*(int *)local_220);
          tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar10);
          if (local_1f8 != local_1e8) {
            operator_delete(local_1f8,local_1e8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          std::ios_base::~ios_base(local_138);
          pTVar18 = local_228;
          if (CVar21 != COORDTYPE_BASIC) break;
          uVar1 = local_1d0 + 1;
          local_220 = (anon_struct_16_3_5cb0d78b *)((long)local_220 + 0x10);
          bVar20 = local_1d0 < 2;
          local_1d0 = uVar1;
        } while (bVar20);
        lVar11 = local_1c0 + 1;
      } while (lVar11 != 3);
      lVar12 = local_1b0 + 1;
    } while (lVar12 != 4);
    lVar12 = local_1b8 + 1;
    if (lVar12 == 3) {
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (pTVar18->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bias",
                 "User-supplied bias value");
      tcu::TestNode::addChild(local_210,pTVar8);
      lVar12 = 0;
      do {
        pTVar10 = (Texture2DMipmapCase *)operator_new(0x100);
        pCVar4 = (local_228->super_TestCaseGroup).m_context;
        Texture2DMipmapCase::Texture2DMipmapCase
                  (pTVar10,(local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                           m_testCtx,pCVar4->m_renderCtx,pCVar4->m_contextInfo,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",COORDTYPE_BASIC_BIAS,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12),0x2901,0x2901,0x1908,
                   0x1401,0x40,0x40);
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar10);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      pTVar18 = local_228;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "generate","Mipmap generation tests");
      tcu::TestNode::addChild(local_210,pTVar8);
      lVar12 = 0;
      do {
        local_218 = init::formats + lVar12;
        lVar11 = 0;
        local_1c8 = lVar12;
        do {
          local_220 = (anon_struct_16_3_5cb0d78b *)(init::tex2DSizes + lVar11);
          uVar7 = 0xcfa201;
          lVar12 = 0;
          local_1d0 = lVar11;
          do {
            local_200 = (TestNode *)CONCAT44(local_200._4_4_,uVar7);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
            pcVar2 = local_218->name;
            if (pcVar2 == (char *)0x0) {
              std::ios::clear((int)&local_228 + (int)*(undefined8 *)(_name + -0x18) + 0x80);
            }
            else {
              sVar9 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
            }
            pcVar2 = local_220->name;
            if (pcVar2 != (char *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
              sVar9 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
            pcVar2 = init::genHints[lVar12].name;
            if (pcVar2 == (char *)0x0) {
              std::ios::clear((int)&local_228 + (int)*(undefined8 *)(_name + -0x18) + 0x80);
            }
            else {
              sVar9 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
            }
            this_00 = (Texture2DGenMipmapCase *)operator_new(0xf0);
            pTVar3 = (pTVar18->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            pRVar5 = ((pTVar18->super_TestCaseGroup).m_context)->m_renderCtx;
            std::__cxx11::stringbuf::str();
            Texture2DGenMipmapCase::Texture2DGenMipmapCase
                      (this_00,pTVar3,pRVar5,(char *)local_1f8,"",local_218->format,
                       local_218->dataType,init::genHints[lVar12].hint,local_220->format,
                       local_220->dataType);
            tcu::TestNode::addChild(pTVar8,(TestNode *)this_00);
            if (local_1f8 != local_1e8) {
              operator_delete(local_1f8,local_1e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
            std::ios_base::~ios_base(local_138);
            pTVar18 = local_228;
            lVar12 = 1;
            uVar7 = 0;
          } while (((ulong)local_200 & 1) != 0);
          lVar11 = local_1d0 + 1;
        } while (lVar11 != 3);
        lVar12 = local_1c8 + 1;
      } while (lVar12 != 8);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (pTVar18->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "min_lod","Lod control: min lod");
      tcu::TestNode::addChild(local_210,pTVar8);
      lVar12 = 0;
      do {
        pTVar13 = (Texture2DLodControlCase *)operator_new(0xe8);
        Texture2DLodControlCase::Texture2DLodControlCase
                  (pTVar13,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture2DLodControlCase_00cfa390;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar13);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_lod","Lod control: max lod");
      tcu::TestNode::addChild(local_210,pTVar8);
      lVar12 = 0;
      do {
        pTVar13 = (Texture2DLodControlCase *)operator_new(0xe8);
        Texture2DLodControlCase::Texture2DLodControlCase
                  (pTVar13,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture2DLodControlCase_00cfa3f0;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar13);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "base_level","Base level");
      tcu::TestNode::addChild(local_210,pTVar8);
      lVar12 = 0;
      do {
        pTVar13 = (Texture2DLodControlCase *)operator_new(0xe8);
        Texture2DLodControlCase::Texture2DLodControlCase
                  (pTVar13,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture2DLodControlCase_00cfa450;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar13);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_level","Max level");
      tcu::TestNode::addChild(local_210,pTVar8);
      lVar12 = 0;
      do {
        pTVar13 = (Texture2DLodControlCase *)operator_new(0xe8);
        Texture2DLodControlCase::Texture2DLodControlCase
                  (pTVar13,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture2DLodControlCase_00cfa4b0;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar13);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      paVar19 = (anon_struct_16_3_1dd0bf0d *)0x0;
      do {
        pTVar8 = (TestNode *)operator_new(0x70);
        local_220 = (anon_struct_16_3_5cb0d78b *)paVar19;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar8,
                   (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   init::cubeCoordTypes[(long)paVar19].name,init::cubeCoordTypes[(long)paVar19].desc
                  );
        tcu::TestNode::addChild(local_208,pTVar8);
        lVar12 = 0;
        do {
          this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
          pCVar4 = (local_228->super_TestCaseGroup).m_context;
          TextureCubeMipmapCase::TextureCubeMipmapCase
                    (this_01,(local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,pCVar4->m_renderCtx,pCVar4->m_contextInfo,
                     *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                     init::cubeCoordTypes[(long)paVar19].type,
                     *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12),0x812f,0x812f,
                     0x1908,0x1401,0x40);
          tcu::TestNode::addChild(pTVar8,(TestNode *)this_01);
          lVar12 = lVar12 + 0x10;
        } while (lVar12 != 0x40);
        paVar19 = (anon_struct_16_3_1dd0bf0d *)((long)&local_220->name + 1);
      } while (paVar19 != (anon_struct_16_3_1dd0bf0d *)0x3);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "generate","Mipmap generation tests");
      tcu::TestNode::addChild(local_208,pTVar8);
      pTVar14 = (TestNode *)0x0;
      do {
        local_220 = init::formats + (long)pTVar14;
        uVar7 = 1;
        lVar12 = 0;
        local_200 = pTVar14;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          pcVar2 = local_220->name;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)&local_228 + (int)*(undefined8 *)(_name + -0x18) + 0x80);
          }
          else {
            sVar9 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
          pcVar2 = init::genHints[lVar12].name;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)&local_228 + (int)*(undefined8 *)(_name + -0x18) + 0x80);
          }
          else {
            sVar9 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
          }
          this_02 = (TextureCubeGenMipmapCase *)operator_new(0xe8);
          local_218 = (anon_struct_16_3_5cb0d78b *)CONCAT44(local_218._4_4_,uVar7);
          pTVar3 = (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pRVar5 = ((local_228->super_TestCaseGroup).m_context)->m_renderCtx;
          std::__cxx11::stringbuf::str();
          TextureCubeGenMipmapCase::TextureCubeGenMipmapCase
                    (this_02,pTVar3,pRVar5,(char *)local_1f8,"",local_220->format,
                     local_220->dataType,init::genHints[lVar12].hint,0x40);
          tcu::TestNode::addChild(pTVar8,(TestNode *)this_02);
          if (local_1f8 != local_1e8) {
            operator_delete(local_1f8,local_1e8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          std::ios_base::~ios_base(local_138);
          lVar12 = 1;
          uVar7 = 0;
        } while (((ulong)local_218 & 1) != 0);
        pTVar14 = (TestNode *)((long)&local_200->_vptr_TestNode + 1);
      } while (pTVar14 != (TestNode *)0x8);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "min_lod","Lod control: min lod");
      tcu::TestNode::addChild(local_208,pTVar8);
      lVar12 = 0;
      do {
        pTVar15 = (TextureCubeLodControlCase *)operator_new(0xe0);
        TextureCubeLodControlCase::TextureCubeLodControlCase
                  (pTVar15,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureCubeLodControlCase_00cfa510;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar15);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_lod","Lod control: max lod");
      tcu::TestNode::addChild(local_208,pTVar8);
      lVar12 = 0;
      do {
        pTVar15 = (TextureCubeLodControlCase *)operator_new(0xe0);
        TextureCubeLodControlCase::TextureCubeLodControlCase
                  (pTVar15,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureCubeLodControlCase_00cfa570;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar15);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "base_level","Base level");
      tcu::TestNode::addChild(local_208,pTVar8);
      lVar12 = 0;
      do {
        pTVar15 = (TextureCubeLodControlCase *)operator_new(0xe0);
        TextureCubeLodControlCase::TextureCubeLodControlCase
                  (pTVar15,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureCubeLodControlCase_00cfa5d0;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar15);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_level","Max level");
      tcu::TestNode::addChild(local_208,pTVar8);
      lVar12 = 0;
      do {
        pTVar15 = (TextureCubeLodControlCase *)operator_new(0xe0);
        TextureCubeLodControlCase::TextureCubeLodControlCase
                  (pTVar15,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar15->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureCubeLodControlCase_00cfa630;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar15);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      lVar12 = 0;
      do {
        pTVar18 = local_228;
        pTVar8 = (TestNode *)operator_new(0x70);
        local_1c0 = lVar12;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar8,
                   (pTVar18->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   init::coordTypes[lVar12].name,init::coordTypes[lVar12].desc);
        local_200 = pTVar8;
        tcu::TestNode::addChild(local_1d8,pTVar8);
        CVar21 = init::coordTypes[lVar12].type;
        lVar12 = 0;
        do {
          local_218 = (anon_struct_16_3_5cb0d78b *)(init::minFilterModes + lVar12);
          lVar11 = 0;
          local_1c8 = lVar12;
          do {
            local_220 = (anon_struct_16_3_5cb0d78b *)(init::wrapModes + lVar11);
            bVar6 = 1;
            lVar12 = 0;
            local_1d0 = lVar11;
            do {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
              pcVar2 = local_218->name;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)&local_228 + (int)*(undefined8 *)(_name + -0x18) + 0x80);
              }
              else {
                sVar9 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
              pcVar2 = local_220->name;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)&local_228 + (int)*(undefined8 *)(_name + -0x18) + 0x80);
              }
              else {
                sVar9 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
              }
              pcVar2 = init::tex3DSizes[lVar12].name;
              if (pcVar2 != (char *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
                sVar9 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar9);
              }
              pTVar16 = (Texture3DMipmapCase *)operator_new(0x100);
              pCVar4 = (pTVar18->super_TestCaseGroup).m_context;
              std::__cxx11::stringbuf::str();
              wrapS = local_220->format;
              Texture3DMipmapCase::Texture3DMipmapCase
                        (pTVar16,pCVar4,(char *)local_1f8,"",CVar21,local_218->format,wrapS,wrapS,
                         wrapS,0x8058,init::tex3DSizes[lVar12].width,init::tex3DSizes[lVar12].height
                         ,init::tex3DSizes[lVar12].depth);
              tcu::TestNode::addChild(local_200,(TestNode *)pTVar16);
              if (local_1f8 != local_1e8) {
                operator_delete(local_1f8,local_1e8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
              std::ios_base::~ios_base(local_138);
              pTVar18 = local_228;
              lVar12 = 1;
              bVar20 = (bool)(CVar21 == COORDTYPE_BASIC & bVar6);
              bVar6 = 0;
            } while (bVar20);
            lVar11 = local_1d0 + 1;
          } while (lVar11 != 3);
          lVar12 = local_1c8 + 1;
        } while (lVar12 != 4);
        lVar12 = local_1c0 + 1;
      } while (lVar12 != 3);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (pTVar18->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bias",
                 "User-supplied bias value");
      tcu::TestNode::addChild(local_1d8,pTVar8);
      lVar12 = 0;
      do {
        pTVar16 = (Texture3DMipmapCase *)operator_new(0x100);
        Texture3DMipmapCase::Texture3DMipmapCase
                  (pTVar16,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",COORDTYPE_BASIC_BIAS,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12),0x2901,0x2901,0x2901,
                   0x8058,0x20,0x20,0x20);
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar16);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "min_lod","Lod control: min lod");
      tcu::TestNode::addChild(local_1d8,pTVar8);
      lVar12 = 0;
      do {
        pTVar17 = (Texture3DLodControlCase *)operator_new(0xe8);
        Texture3DLodControlCase::Texture3DLodControlCase
                  (pTVar17,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture3DLodControlCase_00cfa690;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar17);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_lod","Lod control: max lod");
      tcu::TestNode::addChild(local_1d8,pTVar8);
      lVar12 = 0;
      do {
        pTVar17 = (Texture3DLodControlCase *)operator_new(0xe8);
        Texture3DLodControlCase::Texture3DLodControlCase
                  (pTVar17,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture3DLodControlCase_00cfa6f0;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar17);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "base_level","Base level");
      tcu::TestNode::addChild(local_1d8,pTVar8);
      lVar12 = 0;
      do {
        pTVar17 = (Texture3DLodControlCase *)operator_new(0xe8);
        Texture3DLodControlCase::Texture3DLodControlCase
                  (pTVar17,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture3DLodControlCase_00cfa750;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar17);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_level","Max level");
      tcu::TestNode::addChild(local_1d8,pTVar8);
      lVar12 = 0;
      do {
        pTVar17 = (Texture3DLodControlCase *)operator_new(0xe8);
        Texture3DLodControlCase::Texture3DLodControlCase
                  (pTVar17,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
        (pTVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture3DLodControlCase_00cfa7b0;
        tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar17);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x40);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Mipmapping");
	tcu::TestCaseGroup*	group3D		= new tcu::TestCaseGroup(m_testCtx, "3d",	"3D Texture Mipmapping");
	addChild(group2D);
	addChild(groupCube);
	addChild(group3D);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} genHints[] =
	{
		{ "fastest",	GL_FASTEST },
		{ "nicest",		GL_NICEST }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "npot",		63, 57 },
		{ "non_square",	32, 64 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
		int				depth;
	} tex3DSizes[] =
	{
		{ DE_NULL,		32, 32, 32 }, // Default.
		{ "npot",		33, 29, 27 }
	};

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add non_square variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA, GL_UNSIGNED_BYTE,
																	 tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group2D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT,
														GL_RGBA, GL_UNSIGNED_BYTE,
														tex2DSizes[0].width, tex2DSizes[0].height));
	}

	// 2D mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		group2D->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int size = 0; size < DE_LENGTH_OF_ARRAY(tex2DSizes); size++)
			{
				for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
				{
					std::ostringstream name;
					name << formats[format].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					name << "_" << genHints[hint].name;

					genMipmapGroup->addChild(new Texture2DGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
																		formats[format].format, formats[format].dataType, genHints[hint].hint,
																		tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		group2D->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new Texture2DMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		group2D->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new Texture2DMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		group2D->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new Texture2DBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		group2D->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new Texture2DMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}

	// Cubemap mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		groupCube->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
			{
				std::ostringstream name;
				name << formats[format].name
					 << "_" << genHints[hint].name;

				genMipmapGroup->addChild(new TextureCubeGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "", formats[format].format, formats[format].dataType, genHints[hint].hint, cubeMapSize));
			}
		}
	}

	// Cubemap LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		groupCube->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new TextureCubeMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		groupCube->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new TextureCubeMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		groupCube->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new TextureCubeBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		groupCube->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new TextureCubeMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}

	// 3D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group3D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add other size variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex3DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex3DSizes[size].name)
						name << "_" << tex3DSizes[size].name;

					coordTypeGroup->addChild(new Texture3DMipmapCase(m_context,
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA8,
																	 tex3DSizes[size].width, tex3DSizes[size].height, tex3DSizes[size].depth));
				}
			}
		}
	}

	// 3D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group3D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture3DMipmapCase(m_context,
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT, GL_REPEAT,
														GL_RGBA8,
														tex3DSizes[0].width, tex3DSizes[0].height, tex3DSizes[0].depth));
	}

	// 3D LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		group3D->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new Texture3DMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		group3D->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new Texture3DMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		group3D->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new Texture3DBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		group3D->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new Texture3DMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}
}